

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

void init_tokenizer(void)

{
  ulong uVar1;
  uchar uVar2;
  SymbolInfo val;
  long lVar3;
  byte bVar4;
  
  file_stack_ptr = 0;
  if (tok_sym_table != (SymbolTable *)0x0) {
    free_symbol_table(tok_sym_table);
  }
  tok_sym_table = make_symbol_table();
  lVar3 = 8;
  do {
    val.n._4_4_ = 0;
    val.n._0_4_ = *(uint *)((long)&token_list[0].name + lVar3);
    insert_symbol(tok_sym_table,*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar3),
                  val);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x20a8);
  bVar4 = 0x20;
  lVar3 = 1;
  do {
    break_char_table[(ulong)bVar4 + 1] = '\x01';
    bVar4 = " \t\n\r();"[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  break_char_table[0] = '\x01';
  num_conv_table[0x30] = 0xf0;
  num_conv_table[0x31] = 0xf1;
  uVar1 = 0;
  do {
    if (uVar1 < 6) {
      num_conv_table[uVar1 + 0x32] = (char)uVar1 + 0xe2;
      num_conv_table[uVar1 + 0x33] = (char)uVar1 + 0xe3;
    }
    uVar1 = uVar1 + 2;
  } while (uVar1 != 6);
  num_conv_table[0x38] = 200;
  num_conv_table[0x39] = 0xc9;
  lVar3 = 0;
  do {
    uVar2 = (char)lVar3 + 0x8a;
    num_conv_table[lVar3 + 0x61] = uVar2;
    num_conv_table[lVar3 + 0x41] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 7);
  return;
}

Assistant:

void
init_tokenizer ()
{
  static const unsigned char break_chars[] = " \t\n\r();";
  const unsigned char *p;
  SymbolInfo sym;
  int i;

  /* Start out with 0 open streams. */
  file_stack_ptr = 0;

  /* Initialize the symbol table. */
  if (tok_sym_table != NULL)
    free_symbol_table (tok_sym_table);

  tok_sym_table = make_symbol_table ();
  for (i = 0; i < (sizeof token_list / sizeof token_list[0]); i++)
    {
      sym.n = token_list[i].value;
      insert_symbol (tok_sym_table, token_list[i].name, sym);
    }

  /* Initialize break character table. */
  for (p = &break_chars[0]; *p; p++)
    break_char_table[*p + 1] = TRUE;
  break_char_table[EOF + 1] = TRUE;

  /* Initialize ascii -> number conversion table. */
  num_conv_table['0'] = (ALL_MASKS + 0);
  num_conv_table['1'] = (ALL_MASKS + 1);
  for (i = '2'; i < '8'; i++)
    num_conv_table[i] = (ALL_MASKS - BINARY_MASK) + i - '0';
  num_conv_table['8'] = (DECIMAL_MASK + HEX_MASK + 8);
  num_conv_table['9'] = (DECIMAL_MASK + HEX_MASK + 9);
  for (i = 0; i < 7; i++)
    num_conv_table[i + 'A'] = num_conv_table[i + 'a'] = (HEX_MASK + i + 10);
}